

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O0

void __thiscall ControlParser::parseLinkSetting(ControlParser *this,Network *network)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  InputError *pIVar5;
  char *__to;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [8];
  string settingStr;
  allocator local_91;
  string local_90 [39];
  undefined1 local_69;
  string local_68 [48];
  string local_38 [8];
  string id;
  Network *network_local;
  ControlParser *this_local;
  
  std::__cxx11::string::string(local_38);
  std::operator>>((istream *)this,local_38);
  iVar4 = Network::link(network,(char *)local_38,__to);
  this->link = (Link *)CONCAT44(extraout_var,iVar4);
  if (this->link == (Link *)0x0) {
    local_69 = 1;
    pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_68,local_38);
    InputError::InputError(pIVar5,5,(string *)local_68);
    local_69 = 0;
    __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
  }
  bVar2 = std::ios::eof();
  if ((bVar2 & 1) != 0) {
    pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"",&local_91);
    InputError::InputError(pIVar5,2,(string *)local_90);
    __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
  }
  std::__cxx11::string::string(local_b8);
  std::operator>>((istream *)this,local_b8);
  pcVar1 = w_OPEN;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
  bVar3 = Utilities::match((string *)local_b8,(string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  pcVar1 = w_CLOSED;
  if (bVar3) {
    this->linkStatus = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,pcVar1,&local_101);
    bVar3 = Utilities::match((string *)local_b8,(string *)local_100);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    if (bVar3) {
      this->linkStatus = 0;
    }
    else {
      bVar3 = Utilities::parseNumber<double>((string *)local_b8,&this->linkSetting);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_128,local_b8);
        InputError::InputError(pIVar5,6,(string *)local_128);
        __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
      }
    }
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ControlParser::parseLinkSetting(Network* network)
{
    //... read id of link being controlled
    string id;
    sin >> id;
    link = network->link(id);
    if (link == nullptr) throw InputError(InputError::UNDEFINED_OBJECT, id);

    //... read control setting/status as a string
    if ( sin.eof() ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string settingStr;
    sin >> settingStr;

    //... convert string to status or to numerical value
    if ( Utilities::match(settingStr, w_OPEN) )
    {
        linkStatus = Control::OPEN_STATUS;
    }
    else if ( Utilities::match(settingStr, w_CLOSED) )
    {
        linkStatus = Control::CLOSED_STATUS;
    }
    else if ( !Utilities::parseNumber(settingStr, linkSetting) )
    {
        throw InputError(InputError::INVALID_NUMBER, settingStr);
    }
}